

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O3

char * cmXMLParser::FindAttribute(char **atts,char *attribute)

{
  char *pcVar1;
  int iVar2;
  char *__s1;
  char **ppcVar3;
  
  if ((attribute != (char *)0x0 && atts != (char **)0x0) && (__s1 = *atts, __s1 != (char *)0x0)) {
    ppcVar3 = atts + 2;
    do {
      pcVar1 = ppcVar3[-1];
      if (pcVar1 == (char *)0x0) {
        return (char *)0x0;
      }
      iVar2 = strcmp(__s1,attribute);
      if (iVar2 == 0) {
        return pcVar1;
      }
      __s1 = *ppcVar3;
      ppcVar3 = ppcVar3 + 2;
    } while (__s1 != (char *)0x0);
  }
  return (char *)0x0;
}

Assistant:

const char* cmXMLParser::FindAttribute(const char** atts,
                                       const char* attribute)
{
  if (atts && attribute) {
    for (const char** a = atts; *a && *(a + 1); a += 2) {
      if (strcmp(*a, attribute) == 0) {
        return *(a + 1);
      }
    }
  }
  return nullptr;
}